

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::WrapKeySym(SoftHSM *this,CK_MECHANISM_PTR pMechanism,Token *token,OSObject *wrapKey,
                   ByteString *keydata,ByteString *wrapped)

{
  CK_MECHANISM_TYPE CVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  CryptoFactory *pCVar5;
  undefined4 extraout_var;
  SoftHSM *this_00;
  CK_RV CVar7;
  undefined4 extraout_var_00;
  uchar *__dest;
  long lVar8;
  SoftHSM *pSVar9;
  size_t sStackY_e0;
  undefined8 local_c0;
  ByteString iv;
  ByteString encryptedFinal;
  ByteString local_58;
  long *plVar6;
  
  pSVar9 = (SoftHSM *)keydata;
  ByteString::size(keydata);
  CVar1 = pMechanism->mechanism;
  sStackY_e0 = 0;
  if (CVar1 == 0x133) {
LAB_00140562:
    local_c0 = 0;
  }
  else {
    if (CVar1 == 0x136) {
      sStackY_e0 = 8;
LAB_00140554:
      RFC5652Pad(pSVar9,keydata,sStackY_e0);
      goto LAB_00140562;
    }
    if (CVar1 == 0x1082) {
      local_c0 = 0;
      sStackY_e0 = 0;
    }
    else {
      if (CVar1 == 0x1085) {
        sStackY_e0 = 0x10;
        goto LAB_00140554;
      }
      if (CVar1 == 0x210a) {
        local_c0 = 2;
      }
      else {
        if (CVar1 != 0x2109) {
          return 0x70;
        }
        sVar4 = RFC3394Pad(pSVar9,keydata);
        if (sVar4 < 0x10 || (sVar4 & 7) != 0) {
          return 0x62;
        }
        sStackY_e0 = 0;
        local_c0 = 1;
      }
    }
  }
  pCVar5 = CryptoFactory::i();
  iVar3 = (**pCVar5->_vptr_CryptoFactory)(pCVar5);
  plVar6 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar6 == (long *)0x0) {
    return 0x70;
  }
  this_00 = (SoftHSM *)operator_new(0x38);
  pSVar9 = this_00;
  SymmetricKey::SymmetricKey((SymmetricKey *)this_00,0);
  CVar7 = getSymmetricKey(pSVar9,(SymmetricKey *)this_00,token,wrapKey);
  if (CVar7 != 0) {
    (**(code **)(*plVar6 + 0x50))(plVar6,this_00);
    pCVar5 = CryptoFactory::i();
    (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,plVar6);
    return 5;
  }
  iVar3 = (*((Serialisable *)&this_00->_vptr_SoftHSM)->_vptr_Serialisable[4])(this_00);
  sVar4 = ByteString::size((ByteString *)CONCAT44(extraout_var_00,iVar3));
  (*((Serialisable *)&this_00->_vptr_SoftHSM)->_vptr_Serialisable[6])(this_00,sVar4 * 8);
  ByteString::ByteString(&iv);
  ByteString::ByteString(&encryptedFinal);
  CVar1 = pMechanism->mechanism;
  if ((((CVar1 == 0x133) || (CVar1 == 0x136)) || (CVar1 == 0x1082)) || (CVar1 == 0x1085)) {
    ByteString::resize(&iv,sStackY_e0);
    __dest = ByteString::operator[](&iv,0);
    memcpy(__dest,pMechanism->pParameter,sStackY_e0);
    ByteString::ByteString(&local_58);
    cVar2 = (**(code **)(*plVar6 + 0x10))(plVar6,this_00,1,&iv,0,0,&local_58,0);
    ByteString::~ByteString(&local_58);
    if (cVar2 == '\0') {
      (**(code **)(*plVar6 + 0x50))(plVar6,this_00);
      pCVar5 = CryptoFactory::i();
      (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,plVar6);
      sStackY_e0 = 0x70;
      goto LAB_0014076c;
    }
    cVar2 = (**(code **)(*plVar6 + 0x18))(plVar6,keydata,wrapped);
    lVar8 = *plVar6;
    if (cVar2 == '\0') goto LAB_0014074e;
    cVar2 = (**(code **)(lVar8 + 0x20))(plVar6,&encryptedFinal);
    if (cVar2 == '\0') goto LAB_0014074b;
    ByteString::operator+=(wrapped,&encryptedFinal);
  }
  else {
    cVar2 = (**(code **)(*plVar6 + 0x40))(plVar6,this_00,local_c0,keydata,wrapped);
    if (cVar2 == '\0') {
LAB_0014074b:
      lVar8 = *plVar6;
LAB_0014074e:
      (**(code **)(lVar8 + 0x50))(plVar6,this_00);
      pCVar5 = CryptoFactory::i();
      (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,plVar6);
      sStackY_e0 = 5;
      goto LAB_0014076c;
    }
  }
  (**(code **)(*plVar6 + 0x50))(plVar6,this_00);
  pCVar5 = CryptoFactory::i();
  (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,plVar6);
  sStackY_e0 = 0;
LAB_0014076c:
  ByteString::~ByteString(&encryptedFinal);
  ByteString::~ByteString(&iv);
  return sStackY_e0;
}

Assistant:

CK_RV SoftHSM::WrapKeySym
(
	CK_MECHANISM_PTR pMechanism,
	Token* token,
	OSObject* wrapKey,
	ByteString& keydata,
	ByteString& wrapped
)
{
	// Get the symmetric algorithm matching the mechanism
	SymAlgo::Type algo = SymAlgo::Unknown;
	SymWrap::Type mode = SymWrap::Unknown;
	size_t bb = 8;
	size_t blocksize = 0;
	auto wrappedlen = keydata.size();

	switch(pMechanism->mechanism) {
#ifdef HAVE_AES_KEY_WRAP
		case CKM_AES_KEY_WRAP:
			wrappedlen = RFC3394Pad(keydata);
			if ((wrappedlen < 16) || ((wrappedlen % 8) != 0))
				return CKR_KEY_SIZE_RANGE;
			algo = SymAlgo::AES;
			mode = SymWrap::AES_KEYWRAP;
			break;
#endif
#ifdef HAVE_AES_KEY_WRAP_PAD
		case CKM_AES_KEY_WRAP_PAD:
			algo = SymAlgo::AES;
			mode = SymWrap::AES_KEYWRAP_PAD;
			break;
#endif
		case CKM_AES_CBC:
			algo = SymAlgo::AES;
			break;
			
		case CKM_AES_CBC_PAD:
			blocksize = 16;
			wrappedlen = RFC5652Pad(keydata, blocksize);
			algo = SymAlgo::AES;
			break;
			
		case CKM_DES3_CBC:
			algo = SymAlgo::DES3;
			break;
			
		case CKM_DES3_CBC_PAD:
			blocksize = 8;
			wrappedlen = RFC5652Pad(keydata, blocksize);
			algo = SymAlgo::DES3;
			break;
			
		default:
			return CKR_MECHANISM_INVALID;
	}
	SymmetricAlgorithm* cipher = CryptoFactory::i()->getSymmetricAlgorithm(algo);
	if (cipher == NULL) return CKR_MECHANISM_INVALID;

	SymmetricKey* wrappingkey = new SymmetricKey();

	if (getSymmetricKey(wrappingkey, token, wrapKey) != CKR_OK)
	{
		cipher->recycleKey(wrappingkey);
		CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
		return CKR_GENERAL_ERROR;
	}

	// adjust key bit length
	wrappingkey->setBitLen(wrappingkey->getKeyBits().size() * bb);

	ByteString iv;
	ByteString encryptedFinal;

	switch(pMechanism->mechanism) {

		case CKM_AES_CBC:
	        case CKM_AES_CBC_PAD:
		case CKM_DES3_CBC:
	        case CKM_DES3_CBC_PAD:
			iv.resize(blocksize);
			memcpy(&iv[0], pMechanism->pParameter, blocksize);
			
			if (!cipher->encryptInit(wrappingkey, SymMode::CBC, iv, false))
			{
				cipher->recycleKey(wrappingkey);
				CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
				return CKR_MECHANISM_INVALID;
			}
			if (!cipher->encryptUpdate(keydata, wrapped))
			{
				cipher->recycleKey(wrappingkey);
				CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
				return CKR_GENERAL_ERROR;
			}
			// Finalize encryption
			if (!cipher->encryptFinal(encryptedFinal))
			{
				cipher->recycleKey(wrappingkey);
				CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
				return CKR_GENERAL_ERROR;
			}
			wrapped += encryptedFinal;
			break;
		default:
			// Wrap the key
			if (!cipher->wrapKey(wrappingkey, mode, keydata, wrapped))
			{
				cipher->recycleKey(wrappingkey);
				CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
				return CKR_GENERAL_ERROR;
			}
	}

	cipher->recycleKey(wrappingkey);
	CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
	return CKR_OK;
}